

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

bool CheckEverySoOften(float *_lastCheck,float _interval,float _now)

{
  float _now_local;
  float _interval_local;
  float *_lastCheck_local;
  undefined1 local_1;
  
  if ((*_lastCheck <= 1e-05 && *_lastCheck != 1e-05) || (*_lastCheck + _interval <= _now)) {
    *_lastCheck = _now;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CheckEverySoOften (float& _lastCheck, float _interval, float _now)
{
    if (_lastCheck < 0.00001f ||
        _now >= _lastCheck + _interval) {
        _lastCheck = _now;
        return true;
    }
    return false;
}